

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

LinkIndex __thiscall iDynTree::Model::getFrameLink(Model *this,FrameIndex frameIndex)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  stringstream ss;
  long *local_1d0;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  if ((frameIndex < 0) ||
     (lVar1 = ((long)(this->links).
                     super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->links).
                     super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
     lVar1 - frameIndex == 0 || lVar1 < frameIndex)) {
    lVar1 = (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
    lVar2 = lVar1 * 0x6db6db6db6db6db7;
    lVar1 = frameIndex + lVar1 * -0x6db6db6db6db6db7;
    if ((SBORROW8(frameIndex,lVar2) == lVar1 < 0) &&
       (frameIndex <
        ((long)(this->additionalFrames).
               super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(this->additionalFrames).
               super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>._M_impl
               .super__Vector_impl_data._M_start >> 5) * -0x5555555555555555 + lVar2)) {
      frameIndex = (this->additionalFramesLinks).super__Vector_base<long,_std::allocator<long>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar1];
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"frameIndex ",0xb);
      poVar3 = std::ostream::_M_insert<long>((long)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," is not valid, should be between 0 and ",0x27);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("Model","getFrameLink",(char *)local_1d0);
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0,local_1c0[0] + 1);
      }
      frameIndex = LINK_INVALID_INDEX;
      std::__cxx11::stringstream::~stringstream(local_1b0);
      std::ios_base::~ios_base(local_130);
    }
  }
  return frameIndex;
}

Assistant:

LinkIndex Model::getFrameLink(const FrameIndex frameIndex) const
{
    // The link_H_frame transform for the link
    // main frame is the link it self
    if( frameIndex >= 0 &&
        frameIndex < (FrameIndex) this->getNrOfLinks() )
    {
        return (LinkIndex)frameIndex;
    }

    if( frameIndex >= (FrameIndex) this->getNrOfLinks() &&
        frameIndex < (FrameIndex) this->getNrOfFrames() )
    {
        // For an additonal frame the link index is instead stored
        // in the additionalFramesLinks vector
        return this->additionalFramesLinks[frameIndex-getNrOfLinks()];
    }

    // If the frameIndex is out of bounds, return an invalid index
    std::stringstream ss;
    ss << "frameIndex " << frameIndex << " is not valid, should be between 0 and " << this->getNrOfFrames()-1;
    reportError("Model","getFrameLink",ss.str().c_str());
    return LINK_INVALID_INDEX;
}